

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O2

StackTrace *
Js::JavascriptExceptionOperators::TrimStackTraceForThrownObject
          (StackTrace *stackTraceIn,Var thrownObject,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  uint64 uVar5;
  Recycler *alloc;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this;
  Type *item;
  int iVar6;
  int i;
  int index;
  undefined1 local_60 [8];
  TrackAllocData data;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if ((DAT_01459494 != '\x01') || (scriptContext->threadContext->hasCatchHandler == true)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x584,"(CrawlStackForWER(scriptContext))","CrawlStackForWER(scriptContext)")
    ;
    if (!bVar2) goto LAB_0098d46d;
    *puVar4 = 0;
  }
  if (stackTraceIn == (StackTrace *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x585,"(stackTraceIn)","stackTraceIn");
    if (!bVar2) goto LAB_0098d46d;
    *puVar4 = 0;
  }
  uVar5 = GetStackTraceLimit(thrownObject,scriptContext);
  iVar6 = (int)uVar5;
  if (iVar6 == 0) {
    this = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0;
    if ((stackTraceIn->
        super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
        ).count < 1) {
      this = stackTraceIn;
    }
  }
  else {
    bVar2 = IsErrorInstance(thrownObject);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                         ,0x588,"(stackTraceLimit == 0 || IsErrorInstance(thrownObject))",
                         "stackTraceLimit == 0 || IsErrorInstance(thrownObject)");
      if (!bVar2) goto LAB_0098d46d;
      *puVar4 = 0;
    }
    this = stackTraceIn;
    if (iVar6 < (stackTraceIn->
                super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                ).count) {
      if (iVar6 < 1) {
        this = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)0x0;
      }
      else {
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  ((AutoNestedHandledExceptionType *)&data.field_0x24,
                   ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                   ExceptionType_OutOfMemory);
        local_60 = (undefined1  [8])
                   &JsUtil::
                    List<Js::JavascriptExceptionContext::StackFrame,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                    ::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.plusSize = 0xffffffffffffffff;
        data.count = (size_t)anon_var_dwarf_4c61b2d;
        data.filename._0_4_ = 0x595;
        alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60)
        ;
        this = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)new<Memory::Recycler>(0x30,alloc,0x37a1d4);
        (this->
        super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
        ).alloc = scriptContext->recycler;
        (this->
        super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
        )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_013868e8;
        (this->
        super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
        ).buffer.ptr = (StackFrame *)0x0;
        (this->
        super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
        ).count = 0;
        this->length = 0;
        this->increment = 4;
        for (index = 0; iVar6 != index; index = index + 1) {
          item = JsUtil::
                 List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(stackTraceIn,index);
          JsUtil::
          List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this,item);
        }
        BVar3 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
        if (BVar3 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                             ,0x59b,"(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                             "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
          if (!bVar2) {
LAB_0098d46d:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                  ((AutoNestedHandledExceptionType *)&data.field_0x24);
      }
    }
  }
  return this;
}

Assistant:

JavascriptExceptionContext::StackTrace* JavascriptExceptionOperators::TrimStackTraceForThrownObject(JavascriptExceptionContext::StackTrace* stackTraceIn, Var thrownObject, ScriptContext& scriptContext)
    {
        Assert(CrawlStackForWER(scriptContext)); // Don't trim if crawl for Error.stack
        Assert(stackTraceIn);

        int stackTraceLimit = static_cast<int>(GetStackTraceLimit(thrownObject, &scriptContext));
        Assert(stackTraceLimit == 0 || IsErrorInstance(thrownObject));

        if (stackTraceIn->Count() <= stackTraceLimit)
        {
            return stackTraceIn;
        }

        JavascriptExceptionContext::StackTrace* stackTraceTrimmed = NULL;
        if (stackTraceLimit > 0)
        {
            HRESULT hr;
            BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
            {
                stackTraceTrimmed = RecyclerNew(scriptContext.GetRecycler(), JavascriptExceptionContext::StackTrace, scriptContext.GetRecycler());
                for (int i = 0; i < stackTraceLimit; i++)
                {
                    stackTraceTrimmed->Add(stackTraceIn->Item(i));
                }
            }
            END_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_INSCRIPT(hr);
        }